

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnBrOnExn(SharedValidator *this,Location *loc,Var *depth,Var *event_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  EventType event_type;
  EventType local_88;
  Var local_70;
  
  this->expr_loc_ = loc;
  local_88.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Var::Var(&local_70,event_var);
  RVar1 = CheckEventIndex(this,&local_70,&local_88);
  Var::~Var(&local_70);
  if (depth->type_ == Index) {
    RVar2 = TypeChecker::OnBrOnExn(&this->typechecker_,(depth->field_2).index_,&local_88.params);
    if (local_88.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    RVar3.enum_._1_3_ = 0;
    RVar3.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
    return (Result)RVar3.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/ir.h",
                0x38,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnBrOnExn(const Location& loc,
                                  Var depth,
                                  Var event_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  EventType event_type;
  result |= CheckEventIndex(event_var, &event_type);
  result |= typechecker_.OnBrOnExn(depth.index(), event_type.params);
  return result;
}